

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

void duckdb::ListSortFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  BoundFunctionExpression *pBVar5;
  pointer pFVar6;
  BufferManager *buffer_manager_p;
  idx_t iVar7;
  Vector *pVVar8;
  ulong uVar9;
  list_entry_t *plVar10;
  reference this;
  pointer pSVar11;
  type sorted_data;
  Allocator *allocator;
  Vector *pVVar12;
  uint64_t uVar13;
  idx_t i;
  idx_t iVar14;
  idx_t iVar15;
  uint64_t index;
  long *plVar16;
  idx_t child_idx;
  ulong uVar17;
  bool data_to_sort;
  idx_t local_6c8;
  pointer local_6c0;
  Vector *local_6b8;
  Vector *local_6b0;
  vector<duckdb::LogicalType,_true> *local_6a8;
  uint local_69c;
  TemplatedValidityMask<unsigned_long> *local_698;
  data_ptr_t local_690;
  vector<duckdb::LogicalType,_true> *local_688;
  DataChunk *local_680;
  idx_t local_678;
  SelectionVector sel_sorted;
  SelectionVector sel;
  PayloadScanner scanner;
  LogicalType local_628;
  LogicalType local_610;
  LogicalType local_5f8;
  UnifiedVectorFormat lists_data;
  DataChunk result_chunk;
  Vector sort_result_vec;
  Vector payload_vector;
  Vector lists_indices;
  Vector result_vector;
  LocalSortState local_sort_state;
  GlobalSortState global_sort_state;
  
  local_6c8 = args->count;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(result);
  if ((pvVar4->type).id_ == SQLNULL) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,0);
    return;
  }
  pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar5->bind_info);
  buffer_manager_p =
       BufferManager::GetBufferManager((ClientContext *)pFVar6[0xf]._vptr_FunctionData);
  local_6c0 = pFVar6;
  GlobalSortState::GlobalSortState
            (&global_sort_state,(ClientContext *)pFVar6[0xf]._vptr_FunctionData,
             (vector<duckdb::BoundOrderByNode,_true> *)(pFVar6 + 0x1b),(RowLayout *)(pFVar6 + 0x10))
  ;
  LocalSortState::LocalSortState(&local_sort_state);
  LocalSortState::Initialize(&local_sort_state,&global_sort_state,buffer_manager_p);
  if (*(char *)&local_6c0[8]._vptr_FunctionData == '\x01') {
    LogicalType::LogicalType(&local_5f8,&pvVar4->type);
    Vector::Vector(&sort_result_vec,&local_5f8,0x800);
    LogicalType::~LogicalType(&local_5f8);
  }
  else {
    Vector::Vector(&sort_result_vec,result);
  }
  VectorOperations::Copy(pvVar4,&sort_result_vec,local_6c8,0,0);
  iVar7 = ListVector::GetListSize(&sort_result_vec);
  pVVar8 = ListVector::GetEntry(&sort_result_vec);
  UnifiedVectorFormat::UnifiedVectorFormat(&lists_data);
  Vector::ToUnifiedFormat(&sort_result_vec,local_6c8,&lists_data);
  local_690 = lists_data.data;
  LogicalType::LogicalType(&local_610,USMALLINT);
  local_678 = iVar7;
  Vector::Vector(&lists_indices,&local_610,0x800);
  LogicalType::~LogicalType(&local_610);
  LogicalType::LogicalType(&local_628,UINTEGER);
  local_6b0 = pVVar8;
  Vector::Vector(&payload_vector,&local_628,0x800);
  local_6b8 = result;
  local_698 = &(result->validity).super_TemplatedValidityMask<unsigned_long>;
  local_680 = args;
  LogicalType::~LogicalType(&local_628);
  SelectionVector::SelectionVector(&sel,0x800);
  data_to_sort = false;
  local_688 = (vector<duckdb::LogicalType,_true> *)(local_6c0 + 9);
  local_6a8 = (vector<duckdb::LogicalType,_true> *)(local_6c0 + 0xc);
  uVar3 = 0;
  iVar15 = 0;
  for (iVar7 = 0; iVar14 = local_678, pVVar8 = local_6b8, iVar7 != local_6c8; iVar7 = iVar7 + 1) {
    iVar14 = iVar7;
    if ((lists_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar14 = (idx_t)(lists_data.sel)->sel_vector[iVar7];
    }
    if ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
         >> (iVar14 & 0x3f) & 1) != 0)) {
      plVar16 = (long *)(local_690 + iVar14 * 0x10);
      uVar9 = plVar16[1];
      if (uVar9 != 0) {
        local_69c = uVar3;
        for (uVar17 = 0; uVar17 < uVar9; uVar17 = uVar17 + 1) {
          if (iVar15 == 0x800) {
            SinkDataChunk(local_6b0,&sel,0x800,local_688,local_6a8,&payload_vector,&local_sort_state
                          ,&data_to_sort,&lists_indices);
            iVar15 = 0;
          }
          lVar1 = *plVar16;
          sel.sel_vector[iVar15] = (sel_t)(lVar1 + uVar17);
          *(short *)(lists_indices.data + iVar15 * 2) = (short)iVar7;
          uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(lVar1 + uVar17);
          *(uint *)(payload_vector.data + iVar15 * 4) = uVar3;
          iVar15 = iVar15 + 1;
          uVar9 = plVar16[1];
        }
        uVar3 = local_69c + (int)uVar17;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid(local_698,iVar7);
    }
  }
  if (iVar15 != 0) {
    SinkDataChunk(local_6b0,&sel,iVar15,local_688,local_6a8,&payload_vector,&local_sort_state,
                  &data_to_sort,&lists_indices);
  }
  if (*(char *)&local_6c0[8]._vptr_FunctionData == '\x01') {
    ListVector::Reserve(pVVar8,iVar14);
    ListVector::SetListSize(pVVar8,iVar14);
    plVar10 = ListVector::GetData(pVVar8);
    switchD_0193dc74::default(plVar10,local_690,local_6c8 << 4);
  }
  if (data_to_sort == true) {
    GlobalSortState::AddLocalState(&global_sort_state,&local_sort_state);
    GlobalSortState::PrepareMergePhase(&global_sort_state);
    SelectionVector::SelectionVector(&sel_sorted,(ulong)uVar3);
    this = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
           ::get<true>(&global_sort_state.sorted_blocks,0);
    pSVar11 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator->(this);
    sorted_data = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator*(&pSVar11->payload_data);
    PayloadScanner::PayloadScanner(&scanner,sorted_data,&global_sort_state,true);
    iVar7 = 0;
    do {
      DataChunk::DataChunk(&result_chunk);
      allocator = Allocator::DefaultAllocator();
      DataChunk::Initialize(&result_chunk,allocator,local_6a8,0x800);
      result_chunk.count = 0;
      PayloadScanner::Scan(&scanner,&result_chunk);
      iVar15 = result_chunk.count;
      if (result_chunk.count != 0) {
        pvVar4 = vector<duckdb::Vector,_true>::get<true>(&result_chunk.data,0);
        Vector::Vector(&result_vector,pvVar4);
        for (iVar14 = 0; result_chunk.count != iVar14; iVar14 = iVar14 + 1) {
          sel_sorted.sel_vector[iVar7 + iVar14] = *(sel_t *)(result_vector.data + iVar14 * 4);
        }
        Vector::~Vector(&result_vector);
        iVar7 = iVar7 + iVar14;
        pVVar8 = local_6b8;
      }
      DataChunk::~DataChunk(&result_chunk);
      pVVar12 = local_6b0;
    } while (iVar15 != 0);
    if (*(char *)&local_6c0[8]._vptr_FunctionData == '\x01') {
      pVVar12 = ListVector::GetEntry(pVVar8);
      plVar10 = ListVector::GetData(pVVar8);
      for (iVar7 = 0; iVar7 != local_6c8; iVar7 = iVar7 + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_698,iVar7);
        if (bVar2) {
          uVar13 = plVar10[iVar7].offset;
          for (index = uVar13; index < plVar10[iVar7].length + uVar13; index = index + 1) {
            uVar9 = index;
            if (sel_sorted.sel_vector != (sel_t *)0x0) {
              uVar9 = (ulong)sel_sorted.sel_vector[index];
            }
            Value::BIGINT((Value *)&result_vector,(uVar9 - uVar13) + 1);
            Vector::SetValue(pVVar12,index,(Value *)&result_vector);
            Value::~Value((Value *)&result_vector);
            uVar13 = plVar10[iVar7].offset;
          }
        }
        pVVar8 = local_6b8;
      }
    }
    else {
      Vector::Slice(local_6b0,&sel_sorted,iVar7);
      Vector::Flatten(pVVar12,iVar7);
    }
    PayloadScanner::~PayloadScanner(&scanner);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel_sorted.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  bVar2 = DataChunk::AllConstant(local_680);
  if (bVar2) {
    Vector::SetVectorType(pVVar8,CONSTANT_VECTOR);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Vector::~Vector(&payload_vector);
  Vector::~Vector(&lists_indices);
  UnifiedVectorFormat::~UnifiedVectorFormat(&lists_data);
  Vector::~Vector(&sort_result_vec);
  LocalSortState::~LocalSortState(&local_sort_state);
  GlobalSortState::~GlobalSortState(&global_sort_state);
  return;
}

Assistant:

static void ListSortFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 1 && args.ColumnCount() <= 3);
	auto count = args.size();
	Vector &input_lists = args.data[0];

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto &result_validity = FlatVector::Validity(result);

	if (input_lists.GetType().id() == LogicalTypeId::SQLNULL) {
		result_validity.SetInvalid(0);
		return;
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSortBindData>();

	// initialize the global and local sorting state
	auto &buffer_manager = BufferManager::GetBufferManager(info.context);
	GlobalSortState global_sort_state(info.context, info.orders, info.payload_layout);
	LocalSortState local_sort_state;
	local_sort_state.Initialize(global_sort_state, buffer_manager);

	Vector sort_result_vec = info.is_grade_up ? Vector(input_lists.GetType()) : result;

	// this ensures that we do not change the order of the entries in the input chunk
	VectorOperations::Copy(input_lists, sort_result_vec, count, 0, 0);

	// get the child vector
	auto lists_size = ListVector::GetListSize(sort_result_vec);
	auto &child_vector = ListVector::GetEntry(sort_result_vec);

	// get the lists data
	UnifiedVectorFormat lists_data;
	sort_result_vec.ToUnifiedFormat(count, lists_data);
	auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(lists_data);

	// create the lists_indices vector, this contains an element for each list's entry,
	// the element corresponds to the list's index, e.g. for [1, 2, 4], [5, 4]
	// lists_indices contains [0, 0, 0, 1, 1]
	Vector lists_indices(LogicalType::USMALLINT);
	auto lists_indices_data = FlatVector::GetData<uint16_t>(lists_indices);

	// create the payload_vector, this is just a vector containing incrementing integers
	// this will later be used as the 'new' selection vector of the child_vector, after
	// rearranging the payload according to the sorting order
	Vector payload_vector(LogicalType::UINTEGER);
	auto payload_vector_data = FlatVector::GetData<uint32_t>(payload_vector);

	// selection vector pointing to the data of the child vector,
	// used for slicing the child_vector correctly
	SelectionVector sel(STANDARD_VECTOR_SIZE);

	idx_t offset_lists_indices = 0;
	uint32_t incr_payload_count = 0;
	bool data_to_sort = false;

	for (idx_t i = 0; i < count; i++) {
		auto lists_index = lists_data.sel->get_index(i);
		const auto &list_entry = list_entries[lists_index];

		// nothing to do for this list
		if (!lists_data.validity.RowIsValid(lists_index)) {
			result_validity.SetInvalid(i);
			continue;
		}

		// empty list, no sorting required
		if (list_entry.length == 0) {
			continue;
		}

		for (idx_t child_idx = 0; child_idx < list_entry.length; child_idx++) {
			// lists_indices vector is full, sink
			if (offset_lists_indices == STANDARD_VECTOR_SIZE) {
				SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
				              local_sort_state, data_to_sort, lists_indices);
				offset_lists_indices = 0;
			}

			auto source_idx = list_entry.offset + child_idx;
			sel.set_index(offset_lists_indices, source_idx);
			lists_indices_data[offset_lists_indices] = UnsafeNumericCast<uint16_t>(i);
			payload_vector_data[offset_lists_indices] = NumericCast<uint32_t>(source_idx);
			offset_lists_indices++;
			incr_payload_count++;
		}
	}

	if (offset_lists_indices != 0) {
		SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
		              local_sort_state, data_to_sort, lists_indices);
	}

	if (info.is_grade_up) {
		ListVector::Reserve(result, lists_size);
		ListVector::SetListSize(result, lists_size);
		auto result_data = ListVector::GetData(result);
		memcpy(result_data, list_entries, count * sizeof(list_entry_t));
	}

	if (data_to_sort) {
		// add local state to global state, which sorts the data
		global_sort_state.AddLocalState(local_sort_state);
		global_sort_state.PrepareMergePhase();

		// selection vector that is to be filled with the 'sorted' payload
		SelectionVector sel_sorted(incr_payload_count);
		idx_t sel_sorted_idx = 0;

		// scan the sorted row data
		PayloadScanner scanner(*global_sort_state.sorted_blocks[0]->payload_data, global_sort_state);
		for (;;) {
			DataChunk result_chunk;
			result_chunk.Initialize(Allocator::DefaultAllocator(), info.payload_types);
			result_chunk.SetCardinality(0);
			scanner.Scan(result_chunk);
			if (result_chunk.size() == 0) {
				break;
			}

			// construct the selection vector with the new order from the result vectors
			Vector result_vector(result_chunk.data[0]);
			auto result_data = FlatVector::GetData<uint32_t>(result_vector);
			auto row_count = result_chunk.size();

			for (idx_t i = 0; i < row_count; i++) {
				sel_sorted.set_index(sel_sorted_idx, result_data[i]);
				D_ASSERT(result_data[i] < lists_size);
				sel_sorted_idx++;
			}
		}

		D_ASSERT(sel_sorted_idx == incr_payload_count);
		if (info.is_grade_up) {
			auto &result_entry = ListVector::GetEntry(result);
			auto result_data = ListVector::GetData(result);
			for (idx_t i = 0; i < count; i++) {
				if (!result_validity.RowIsValid(i)) {
					continue;
				}
				for (idx_t j = result_data[i].offset; j < result_data[i].offset + result_data[i].length; j++) {
					auto b = sel_sorted.get_index(j) - result_data[i].offset;
					result_entry.SetValue(j, Value::BIGINT(UnsafeNumericCast<int64_t>(b + 1)));
				}
			}
		} else {
			child_vector.Slice(sel_sorted, sel_sorted_idx);
			child_vector.Flatten(sel_sorted_idx);
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}